

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall VarianceEstimator_Merge_Test::TestBody(VarianceEstimator_Merge_Test *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  AssertHelper *this_01;
  VarianceEstimator<double> *pVVar3;
  double dVar4;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *this_02;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float err;
  VarianceEstimator<double> *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *__range1_1;
  VarianceEstimator<double> veFinal;
  int index;
  Float v;
  Float u;
  Stratified1DIter __end1;
  Stratified1DIter __begin1;
  Stratified1D *__range1;
  double sum;
  int count;
  RNG rng;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> ve;
  int n;
  Stratified1DIter *in_stack_fffffffffffffe28;
  IndexingIterator<pbrt::detail::Stratified1DIter> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  VarianceEstimator<double> *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  int iVar5;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Type type;
  AssertHelper *in_stack_fffffffffffffe60;
  Message *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_140;
  double local_128;
  double *in_stack_fffffffffffffee0;
  float *val1;
  char *in_stack_fffffffffffffef0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  __normal_iterator<pbrt::VarianceEstimator<double>_*,_std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  local_e8;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *local_e0;
  VarianceEstimator<double> local_d8;
  int local_bc;
  Float local_b8;
  Float local_b4;
  IndexingIterator<pbrt::detail::Stratified1DIter> local_98 [3];
  undefined1 local_80 [24];
  undefined1 *local_68;
  double local_60;
  int local_54;
  RNG local_50 [2];
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  local_28;
  undefined4 local_c;
  
  local_c = 0x10;
  std::allocator<pbrt::VarianceEstimator<double>_>::allocator
            ((allocator<pbrt::VarianceEstimator<double>_> *)0x6441d9);
  std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
  vector(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
         (allocator_type *)in_stack_fffffffffffffe40);
  std::allocator<pbrt::VarianceEstimator<double>_>::~allocator
            ((allocator<pbrt::VarianceEstimator<double>_> *)0x6441ff);
  pbrt::RNG::RNG(local_50);
  local_54 = 10000;
  local_60 = 0.0;
  pbrt::Stratified1D::RNGGenerator
            ((Stratified1D *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
             (uint64_t)in_stack_fffffffffffffe30,(uint64_t)in_stack_fffffffffffffe28);
  local_68 = local_80;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            ((IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
             in_stack_fffffffffffffe30);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            ((IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
             in_stack_fffffffffffffe30);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Stratified1DIter>::operator!=
                           (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28), bVar1) {
    local_b4 = pbrt::detail::Stratified1DIter::operator*
                         ((Stratified1DIter *)in_stack_fffffffffffffe30);
    local_b8 = pbrt::Lerp(local_b4,-1.0,1.0);
    std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
    ::size(&local_28);
    local_bc = pbrt::RNG::Uniform<int>
                         ((RNG *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                          in_stack_fffffffffffffe30);
    this_00 = std::
              vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
              ::operator[](&local_28,(long)local_bc);
    pbrt::VarianceEstimator<double>::Add(this_00,(double)local_b8);
    local_60 = (double)local_b8 + local_60;
    pbrt::detail::IndexingIterator<pbrt::detail::Stratified1DIter>::operator++(local_98);
  }
  pbrt::VarianceEstimator<double>::VarianceEstimator(&local_d8);
  local_e0 = &local_28;
  local_e8._M_current =
       (VarianceEstimator<double> *)
       std::
       vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
       begin((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
              *)in_stack_fffffffffffffe28);
  std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
  end((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> *)
      in_stack_fffffffffffffe28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::VarianceEstimator<double>_*,_std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<pbrt::VarianceEstimator<double>_*,_std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                        *)in_stack_fffffffffffffe28);
    type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    iVar5 = (int)(in_stack_fffffffffffffe48 >> 0x20);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<pbrt::VarianceEstimator<double>_*,_std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::operator*(&local_e8);
    pbrt::VarianceEstimator<double>::Merge
              (in_stack_fffffffffffffe40,
               (VarianceEstimator<double> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    __gnu_cxx::
    __normal_iterator<pbrt::VarianceEstimator<double>_*,_std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::operator++(&local_e8);
  }
  pVVar3 = &local_d8;
  pbrt::VarianceEstimator<double>::Variance(pVVar3);
  std::abs((int)pVVar3);
  val1 = (float *)0x3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<float,double>
            ((char *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0,
             (float *)0x3f50624dd2f1a9fc,in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffef0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    local_128 = pbrt::VarianceEstimator<double>::Variance(&local_d8);
    in_stack_fffffffffffffe60 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x644595);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,type,(char *)in_stack_fffffffffffffe50,iVar5,
               (char *)in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x6445ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x644647);
  dVar4 = local_60 / (double)local_54;
  pVVar3 = &local_d8;
  pcVar2 = (char *)pbrt::VarianceEstimator<double>::Mean(pVVar3);
  this_02 = (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
             *)((dVar4 - (double)pcVar2) / (local_60 / (double)local_54));
  std::abs((int)pVVar3);
  iVar5 = (int)((ulong)dVar4 >> 0x20);
  testing::internal::CmpHelperLT<float,double>
            ((char *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0,val1,
             in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x64476a)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,type,pcVar2,iVar5,(char *)this_02);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x6447c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x64481c);
  std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
  ~vector(this_02);
  return;
}

Assistant:

TEST(VarianceEstimator, Merge) {
    int n = 16;
    std::vector<VarianceEstimator<double>> ve(n);

    RNG rng;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        int index = rng.Uniform<int>(ve.size());
        ve[index].Add(v);
        sum += v;
    }

    VarianceEstimator<double> veFinal;
    for (const auto &v : ve)
        veFinal.Merge(v);

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(veFinal.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << veFinal.Variance();

    err = std::abs((sum / count - veFinal.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}